

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# efd.c
# Opt level: O1

int nn_efd_wait(nn_efd *self,int timeout)

{
  int iVar1;
  undefined8 in_RAX;
  int *piVar2;
  pollfd pfd;
  pollfd local_8;
  
  local_8.revents = (short)((ulong)in_RAX >> 0x30);
  local_8.events = 1;
  local_8.fd = self->efd;
  if (self->efd < 0) {
    iVar1 = -9;
  }
  else {
    iVar1 = poll(&local_8,1,timeout);
    if (iVar1 == 0) {
      iVar1 = -0x6e;
    }
    else if (iVar1 == -1) {
      piVar2 = __errno_location();
      iVar1 = -*piVar2;
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int nn_efd_wait (struct nn_efd *self, int timeout)
{
    int rc;
    struct pollfd pfd;

    pfd.fd = nn_efd_getfd (self);
    pfd.events = POLLIN;
    if (pfd.fd < 0)
        return -EBADF;

    rc = poll (&pfd, 1, timeout);
    switch (rc) {
    case 0:
        return -ETIMEDOUT;
    case -1:
        return (-errno);
    }
    return 0;
}